

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  double local_e8;
  long local_e0;
  double local_c0;
  REF_BOOL *local_b8;
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = ref_grid->node;
  *allowed = 0;
  lVar5 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar5 = 0x50;
  }
  dVar10 = 1e+200;
  dVar9 = -1.0;
  if (-1 < node1) {
    ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar5 + -0x10);
    pRVar1 = ref_cell->ref_adj;
    if (node1 < pRVar1->nnode) {
      local_e0 = (long)pRVar1->first[(uint)node1];
      local_e8 = -1.0;
      dVar11 = 1e+200;
      if (local_e0 != -1) {
        uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[local_e0].ref,local_a8);
        if (uVar4 == 0) {
          dVar10 = 1e+200;
          dVar9 = -1.0;
          local_e8 = -1.0;
          dVar11 = 1e+200;
          local_b8 = allowed;
          do {
            uVar4 = ref_cell->node_per;
            if (0 < (int)uVar4) {
              lVar5 = 0;
              do {
                if (local_a8[lVar5] != node1) {
                  uVar4 = ref_node_ratio(local_b0,node1,local_a8[lVar5],&local_c0);
                  if (uVar4 != 0) {
                    uVar7 = (ulong)uVar4;
                    pcVar8 = "ratio";
                    uVar6 = 0x37f;
                    goto LAB_00165054;
                  }
                  if (dVar9 <= local_c0) {
                    dVar9 = local_c0;
                  }
                  if (local_c0 <= dVar10) {
                    dVar10 = local_c0;
                  }
                  uVar4 = ref_cell->node_per;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < (int)uVar4);
              allowed = local_b8;
              if (0 < (int)uVar4) {
                uVar7 = 0;
                bVar3 = false;
                do {
                  if (local_a8[uVar7] == node0) {
                    bVar3 = true;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
                if ((!bVar3) && (0 < (int)uVar4)) {
                  lVar5 = 0;
                  do {
                    if (local_a8[lVar5] != node1) {
                      uVar4 = ref_node_ratio(local_b0,node0,local_a8[lVar5],&local_c0);
                      if (uVar4 != 0) {
                        uVar7 = (ulong)uVar4;
                        pcVar8 = "ratio";
                        uVar6 = 0x38c;
                        goto LAB_00165054;
                      }
                      if (local_e8 <= local_c0) {
                        local_e8 = local_c0;
                      }
                      if (local_c0 <= dVar11) {
                        dVar11 = local_c0;
                      }
                      uVar4 = ref_cell->node_per;
                    }
                    lVar5 = lVar5 + 1;
                    allowed = local_b8;
                  } while (lVar5 < (int)uVar4);
                }
              }
            }
            pRVar2 = ref_cell->ref_adj->item;
            local_e0 = (long)pRVar2[(int)local_e0].next;
            if (local_e0 == -1) goto LAB_00164e4b;
            uVar4 = ref_cell_nodes(ref_cell,pRVar2[local_e0].ref,local_a8);
          } while (uVar4 == 0);
        }
        uVar7 = (ulong)uVar4;
        pcVar8 = "nodes";
        uVar6 = 0x37b;
LAB_00165054:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar6,"ref_collapse_edge_ratio",uVar7,pcVar8);
        return (REF_STATUS)uVar7;
      }
      goto LAB_00164e4b;
    }
  }
  local_e8 = -1.0;
  dVar11 = 1e+200;
LAB_00164e4b:
  if ((ref_grid->adapt->post_min_ratio <= dVar11) && (local_e8 <= ref_grid->adapt->post_max_ratio))
  {
    *allowed = 1;
  }
  if ((dVar10 <= dVar11) && (local_e8 <= dVar9)) {
    *allowed = 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_DBL edge_ratio;
  REF_DBL old_max, old_min, new_max, new_min;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  old_max = -1.0;
  old_min = REF_DBL_MAX;
  new_max = -1.0;
  new_min = REF_DBL_MAX;
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node1, nodes[node], &edge_ratio), "ratio");
        old_max = MAX(old_max, edge_ratio);
        old_min = MIN(old_min, edge_ratio);
      }
    }

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node0, nodes[node], &edge_ratio), "ratio");
        new_max = MAX(new_max, edge_ratio);
        new_min = MIN(new_min, edge_ratio);
      }
  }

  if ((new_min >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
      (new_max <= ref_grid_adapt(ref_grid, post_max_ratio))) {
    *allowed = REF_TRUE;
  }

  if (new_min >= old_min && new_max <= old_max) {
    *allowed = REF_TRUE;
  }

  return REF_SUCCESS;
}